

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool art_internal_validate_at(art_t *art,art_ref_t ref,art_internal_validate_t validator)

{
  long lVar1;
  byte bVar2;
  art_ref_t aVar3;
  art_internal_validate_t validator_00;
  art_internal_validate_t validator_01;
  art_internal_validate_t validator_02;
  art_internal_validate_t validator_03;
  art_validate_cb_t p_Var4;
  art_t *art_00;
  _Bool _Var5;
  int iVar6;
  char **ppcVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  art_typecode_t typecode;
  void *pvVar18;
  int i;
  undefined8 uStack_50;
  art_key_chunk_t local_48;
  art_key_chunk_t aStack_47;
  undefined6 uStack_46;
  art_t *local_38;
  
  iVar6 = validator.depth;
  ppcVar7 = validator.reason;
  if (ref == 0) {
    pcVar10 = "node is null";
  }
  else if ((ref & 0xff) == 1) {
    pvVar18 = (void *)((ref >> 0xc & 0xfffffffffffffff0) + (long)art->nodes[1]);
    uVar8 = (ulong)(byte)validator.depth;
    validator.depth = iVar6;
    iVar6 = bcmp(pvVar18,validator.current_key,uVar8);
    ppcVar7 = validator.reason;
    if (iVar6 == 0) {
      if (validator.validate_cb == (art_validate_cb_t)0x0) {
        return true;
      }
      _Var5 = (*validator.validate_cb)
                        (*(art_val_t *)((long)pvVar18 + 8),validator.reason,validator.context);
      if (!_Var5) {
        if (*ppcVar7 != (char *)0x0) {
          return false;
        }
        *ppcVar7 = "leaf validation failed";
        return false;
      }
      return true;
    }
    pcVar10 = "leaf key does not match its position\'s prefix in the tree";
  }
  else {
    uVar8 = (ulong)(uint)((int)(ref & 0xff) << 3);
    lVar17 = *(long *)((long)art->nodes + uVar8);
    lVar15 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar8);
    bVar2 = *(byte *)(lVar17 + lVar15);
    if ((int)(validator.depth + (uint)bVar2) < 6) {
      lVar11 = lVar17 + lVar15;
      local_38 = art;
      memcpy(validator.current_key + validator.depth,(void *)(lVar11 + 1),(ulong)bVar2);
      art_00 = local_38;
      pvVar18 = validator.context;
      p_Var4 = validator.validate_cb;
      ppcVar7 = validator.reason;
      validator.depth = validator.depth + (uint)bVar2;
      switch((uint)ref & 0xff) {
      case 2:
        local_48 = validator.current_key[4];
        aStack_47 = validator.current_key[5];
        uStack_46 = validator._34_6_;
        bVar2 = *(byte *)(lVar11 + 6);
        if (bVar2 == 0) {
          pcVar10 = "Node4 has no children";
        }
        else if (bVar2 < 5) {
          if (bVar2 == 1) {
            pcVar10 = "Node4 and child node should have been combined";
          }
          else {
            uStack_50 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
            lVar15 = lVar17 + 0x18 + lVar15;
            lVar17 = -1;
            uVar8 = 0;
            while( true ) {
              uVar12 = (ulong)*(byte *)(lVar11 + 6);
              if (uVar12 <= uVar8) {
                return true;
              }
              if ((uVar8 != 0) && (*(byte *)(lVar11 + 7 + uVar8) <= *(byte *)(lVar11 + 6 + uVar8)))
              break;
              aVar3 = *(art_ref_t *)(lVar11 + 0x10 + uVar8 * 8);
              if (uVar8 + 1 < uVar12) {
                lVar16 = 0;
                do {
                  if (aVar3 == *(art_ref_t *)(lVar15 + lVar16 * 8)) {
                    pcVar10 = "Node4 has duplicate children";
                    goto LAB_0010548c;
                  }
                  lVar16 = lVar16 + 1;
                } while (uVar12 + lVar17 != lVar16);
              }
              *(undefined1 *)((long)&uStack_50 + (long)(int)uStack_50 + 3) =
                   *(undefined1 *)(lVar11 + 7 + uVar8);
              validator_02.validate_cb = p_Var4;
              validator_02.reason = ppcVar7;
              validator_02.context = pvVar18;
              validator_02.depth = (int)uStack_50;
              validator_02.current_key[0] = uStack_50._4_1_;
              validator_02.current_key[1] = uStack_50._5_1_;
              validator_02.current_key[2] = uStack_50._6_1_;
              validator_02.current_key[3] = uStack_50._7_1_;
              validator_02.current_key[4] = local_48;
              validator_02.current_key[5] = aStack_47;
              validator_02._34_6_ = uStack_46;
              _Var5 = art_internal_validate_at(art_00,aVar3,validator_02);
              lVar15 = lVar15 + 8;
              lVar17 = lVar17 + -1;
              uVar8 = uVar8 + 1;
              if (!_Var5) {
                return false;
              }
            }
            pcVar10 = "Node4 keys are not strictly increasing";
          }
        }
        else {
          pcVar10 = "Node4 has too many children";
        }
        break;
      case 3:
        local_48 = validator.current_key[4];
        aStack_47 = validator.current_key[5];
        uStack_46 = validator._34_6_;
        if (*(byte *)(lVar11 + 6) < 5) {
          pcVar10 = "Node16 has too few children";
        }
        else if (*(byte *)(lVar11 + 6) < 0x11) {
          uStack_50 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
          lVar15 = lVar17 + 0x20 + lVar15;
          lVar17 = -1;
          uVar8 = 0;
          while( true ) {
            uVar12 = (ulong)*(byte *)(lVar11 + 6);
            if (uVar12 <= uVar8) {
              return true;
            }
            if ((uVar8 != 0) && (*(byte *)(lVar11 + 7 + uVar8) <= *(byte *)(lVar11 + 6 + uVar8)))
            break;
            aVar3 = *(art_ref_t *)(lVar11 + 0x18 + uVar8 * 8);
            if (uVar8 + 1 < uVar12) {
              lVar16 = 0;
              do {
                if (aVar3 == *(art_ref_t *)(lVar15 + lVar16 * 8)) {
                  pcVar10 = "Node16 has duplicate children";
                  goto LAB_0010548c;
                }
                lVar16 = lVar16 + 1;
              } while (uVar12 + lVar17 != lVar16);
            }
            *(undefined1 *)((long)&uStack_50 + (long)(int)uStack_50 + 3) =
                 *(undefined1 *)(lVar11 + 7 + uVar8);
            validator_01.validate_cb = p_Var4;
            validator_01.reason = ppcVar7;
            validator_01.context = pvVar18;
            validator_01.depth = (int)uStack_50;
            validator_01.current_key[0] = uStack_50._4_1_;
            validator_01.current_key[1] = uStack_50._5_1_;
            validator_01.current_key[2] = uStack_50._6_1_;
            validator_01.current_key[3] = uStack_50._7_1_;
            validator_01.current_key[4] = local_48;
            validator_01.current_key[5] = aStack_47;
            validator_01._34_6_ = uStack_46;
            _Var5 = art_internal_validate_at(art_00,aVar3,validator_01);
            lVar15 = lVar15 + 8;
            lVar17 = lVar17 + -1;
            uVar8 = uVar8 + 1;
            if (!_Var5) {
              return false;
            }
          }
          pcVar10 = "Node16 keys are not strictly increasing";
        }
        else {
          pcVar10 = "Node16 has too many children";
        }
        break;
      case 4:
        local_48 = validator.current_key[4];
        aStack_47 = validator.current_key[5];
        uStack_46 = validator._34_6_;
        if (*(byte *)(lVar11 + 6) < 0x11) {
          pcVar10 = "Node48 has too few children";
        }
        else if (*(byte *)(lVar11 + 6) < 0x31) {
          lVar17 = lVar11 + 0x110;
          lVar15 = 0;
          uVar8 = 0;
          do {
            bVar2 = *(byte *)(lVar11 + 0x10 + lVar15);
            uVar12 = (ulong)bVar2;
            if (uVar12 != 0x30) {
              if ((uVar8 >> (uVar12 & 0x3f) & 1) != 0) {
                pcVar10 = "Node48 keys point to the same child index";
                goto LAB_0010548c;
              }
              if (*(long *)(lVar17 + uVar12 * 8) == 0) {
                pcVar10 = "Node48 has a NULL child";
                goto LAB_0010548c;
              }
              uVar8 = uVar8 | 1L << (bVar2 & 0x3f);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x100);
          if ((*(ulong *)(lVar11 + 8) ^ uVar8) == 0xffffffffffff) {
            if (uVar8 != 0) {
              while (uVar12 = uVar8 - 1 & uVar8, uVar12 != 0) {
                lVar15 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                  }
                }
                uVar13 = uVar12;
                do {
                  lVar16 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                    }
                  }
                  if (*(long *)(lVar17 + lVar15 * 8) == *(long *)(lVar17 + lVar16 * 8)) {
                    pcVar10 = "Node48 has duplicate children";
                    goto LAB_0010548c;
                  }
                  uVar13 = uVar13 & uVar13 - 1;
                  uVar8 = uVar12;
                } while (uVar13 != 0);
              }
            }
            uStack_50 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
            lVar15 = 0;
            do {
              uVar8 = (ulong)*(byte *)(lVar11 + 0x10 + lVar15);
              if (uVar8 != 0x30) {
                *(char *)((long)&uStack_50 + (long)(int)uStack_50 + 3) = (char)lVar15;
                validator_03.validate_cb = p_Var4;
                validator_03.reason = ppcVar7;
                validator_03.context = pvVar18;
                validator_03.depth = (int)uStack_50;
                validator_03.current_key[0] = uStack_50._4_1_;
                validator_03.current_key[1] = uStack_50._5_1_;
                validator_03.current_key[2] = uStack_50._6_1_;
                validator_03.current_key[3] = uStack_50._7_1_;
                validator_03.current_key[4] = local_48;
                validator_03.current_key[5] = aStack_47;
                validator_03._34_6_ = uStack_46;
                _Var5 = art_internal_validate_at
                                  (art_00,*(art_ref_t *)(lVar17 + uVar8 * 8),validator_03);
                if (!_Var5) {
                  return false;
                }
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x100);
            return true;
          }
          pcVar10 = "Node48 available_children does not match actual children";
        }
        else {
          pcVar10 = "Node48 has too many children";
        }
        break;
      case 5:
        local_48 = validator.current_key[4];
        aStack_47 = validator.current_key[5];
        uStack_46 = validator._34_6_;
        if (*(ushort *)(lVar11 + 6) < 0x31) {
          pcVar10 = "Node256 has too few children";
        }
        else if (*(ushort *)(lVar11 + 6) < 0x101) {
          uStack_50 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
          lVar16 = 0;
          uVar14 = 0;
          do {
            aVar3 = *(art_ref_t *)(lVar11 + 8 + lVar16 * 8);
            if (aVar3 != 0) {
              uVar14 = uVar14 + 1;
              lVar9 = lVar16;
              while (lVar9 != 0xff) {
                lVar1 = lVar9 * 8;
                lVar9 = lVar9 + 1;
                if (aVar3 == *(art_ref_t *)(lVar17 + 0x10 + lVar15 + lVar1)) {
                  pcVar10 = "Node256 has duplicate children";
                  goto LAB_0010548c;
                }
              }
              *(char *)((long)&uStack_50 + (long)(int)uStack_50 + 3) = (char)lVar16;
              validator_00.validate_cb = p_Var4;
              validator_00.reason = ppcVar7;
              validator_00.context = pvVar18;
              validator_00.depth = (int)uStack_50;
              validator_00.current_key[0] = uStack_50._4_1_;
              validator_00.current_key[1] = uStack_50._5_1_;
              validator_00.current_key[2] = uStack_50._6_1_;
              validator_00.current_key[3] = uStack_50._7_1_;
              validator_00.current_key[4] = local_48;
              validator_00.current_key[5] = aStack_47;
              validator_00._34_6_ = uStack_46;
              _Var5 = art_internal_validate_at(art_00,aVar3,validator_00);
              if (!_Var5) {
                return false;
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x100);
          if (uVar14 == *(ushort *)(lVar11 + 6)) {
            return true;
          }
          pcVar10 = "Node256 count does not match actual children";
        }
        else {
          pcVar10 = "Node256 has too many children";
        }
        break;
      default:
        pcVar10 = "invalid node type";
      }
    }
    else {
      pcVar10 = "node has too much prefix at given depth";
    }
  }
LAB_0010548c:
  *ppcVar7 = pcVar10;
  return false;
}

Assistant:

static bool art_internal_validate_at(const art_t *art, art_ref_t ref,
                                     art_internal_validate_t validator) {
    if (ref == CROARING_ART_NULL_REF) {
        return art_validate_fail(&validator, "node is null");
    }
    if (art_is_leaf(ref)) {
        art_leaf_t *leaf = (art_leaf_t *)art_deref(art, ref);
        if (art_compare_prefix(leaf->key, 0, validator.current_key, 0,
                               validator.depth) != 0) {
            return art_validate_fail(&validator,
                                     "leaf key does not match its "
                                     "position's prefix in the tree");
        }
        if (validator.validate_cb != NULL &&
            !validator.validate_cb(leaf->val, validator.reason,
                                   validator.context)) {
            if (*validator.reason == NULL) {
                *validator.reason = "leaf validation failed";
            }
            return false;
        }
    } else {
        art_inner_node_t *inner_node = (art_inner_node_t *)art_deref(art, ref);

        if (validator.depth + inner_node->prefix_size + 1 > ART_KEY_BYTES) {
            return art_validate_fail(&validator,
                                     "node has too much prefix at given depth");
        }
        memcpy(validator.current_key + validator.depth, inner_node->prefix,
               inner_node->prefix_size);
        validator.depth += inner_node->prefix_size;

        switch (art_ref_typecode(ref)) {
            case CROARING_ART_NODE4_TYPE:
                if (!art_node4_internal_validate(art, (art_node4_t *)inner_node,
                                                 validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE16_TYPE:
                if (!art_node16_internal_validate(
                        art, (art_node16_t *)inner_node, validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE48_TYPE:
                if (!art_node48_internal_validate(
                        art, (art_node48_t *)inner_node, validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE256_TYPE:
                if (!art_node256_internal_validate(
                        art, (art_node256_t *)inner_node, validator)) {
                    return false;
                }
                break;
            default:
                return art_validate_fail(&validator, "invalid node type");
        }
    }
    return true;
}